

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::minimize_clause(Internal *this)

{
  int64_t *piVar1;
  pointer pFVar2;
  uint uVar3;
  Internal *pIVar4;
  uint *puVar5;
  unsigned_long *puVar6;
  uint uVar7;
  bool bVar8;
  pointer puVar9;
  unsigned_long *puVar10;
  Profile *in_RSI;
  uint *puVar11;
  iterator __position;
  uint *puVar12;
  pointer puVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  vector<int,_std::allocator<int>_> stack;
  unsigned_long p;
  vector<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> *local_40;
  unsigned_long local_38;
  
  pIVar4 = this->internal;
  __position._M_current = (unsigned_long *)in_RSI;
  if ((pIVar4->profiles).minimize.level <= (pIVar4->opts).profile) {
    __position._M_current = (unsigned_long *)&(pIVar4->profiles).minimize;
    time(pIVar4,(time_t *)in_RSI);
    start_profiling(pIVar4,(Profile *)__position._M_current,
                    (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  if (this->external->solution != (char *)0x0) {
    External::check_solution_on_learned_clause(this->external);
  }
  minimize_sort_clause(this);
  puVar11 = (uint *)(this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  puVar5 = (uint *)(this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar11 != puVar5) {
    local_40 = &this->clause;
    puVar12 = puVar11;
    do {
      __position._M_current = (unsigned_long *)(ulong)-*puVar12;
      bVar8 = minimize_literal(this,-*puVar12,0);
      if (bVar8) {
        if (this->lrat == true) {
          __position._M_current = (unsigned_long *)(ulong)-*puVar12;
          calculate_minimize_chain(this,-*puVar12,&local_58);
          puVar10 = (this->mini_chain).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar6 = (this->mini_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (puVar10 != puVar6) {
            do {
              local_38 = *puVar10;
              __position._M_current =
                   (this->minimize_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->minimize_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                           &this->minimize_chain,__position,&local_38);
              }
              else {
                *__position._M_current = local_38;
                __position._M_current = __position._M_current + 1;
                (this->minimize_chain).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current;
              }
              puVar10 = puVar10 + 1;
            } while (puVar10 != puVar6);
            puVar13 = (this->mini_chain).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish != puVar13) {
              (this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish = puVar13;
            }
          }
        }
        piVar1 = &(this->stats).minimized;
        *piVar1 = *piVar1 + 1;
      }
      else {
        uVar3 = *puVar12;
        *puVar11 = uVar3;
        puVar11 = puVar11 + 1;
        uVar7 = -uVar3;
        if (0 < (int)uVar3) {
          uVar7 = uVar3;
        }
        pFVar2 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar7;
        *pFVar2 = (Flags)((uint)*pFVar2 | 2);
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar5);
    if (puVar11 != puVar5) {
      __position._M_current =
           (unsigned_long *)
           ((long)puVar11 -
            (long)(local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2);
      std::vector<int,_std::allocator<int>_>::resize(local_40,(size_type)__position._M_current);
    }
  }
  clear_minimized_literals(this);
  puVar9 = (this->minimize_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar13 = (this->minimize_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != puVar9) {
    do {
      puVar13 = puVar13 + -1;
      __position._M_current =
           (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->lrat_chain,
                   __position,puVar13);
        puVar9 = (this->minimize_chain).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = *puVar13;
        __position._M_current = __position._M_current + 1;
        (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current;
      }
    } while (puVar13 != puVar9);
    puVar13 = (this->minimize_chain).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (puVar13 != puVar9) {
    (this->minimize_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar9;
  }
  pIVar4 = this->internal;
  if ((pIVar4->profiles).minimize.level <= (pIVar4->opts).profile) {
    time(pIVar4,(time_t *)__position._M_current);
    stop_profiling(pIVar4,&(pIVar4->profiles).minimize,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Internal::minimize_clause () {
  START (minimize);
  LOG (clause, "minimizing first UIP clause");

  external->check_learned_clause (); // check 1st UIP learned clause first
  minimize_sort_clause ();

  assert (minimized.empty ());
  assert (minimize_chain.empty ());
  const auto end = clause.end ();
  auto j = clause.begin (), i = j;
  std::vector<int> stack;
  for (; i != end; i++) {
    if (minimize_literal (-*i)) {
      if (lrat) {
        assert (mini_chain.empty ());
        calculate_minimize_chain (-*i, stack);
        for (auto p : mini_chain) {
          minimize_chain.push_back (p);
        }
        mini_chain.clear ();
      }
      stats.minimized++;
    } else
      flags (*j++ = *i).keep = true;
  }
  LOG ("minimized %zd literals", (size_t) (clause.end () - j));
  if (j != end)
    clause.resize (j - clause.begin ());
  clear_minimized_literals ();
  for (auto p = minimize_chain.rbegin (); p != minimize_chain.rend ();
       p++) {
    lrat_chain.push_back (*p);
  }
  minimize_chain.clear ();
  STOP (minimize);
}